

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O0

MaybeStackArray<char16_t,_4> * __thiscall
icu_63::MaybeStackArray<char16_t,_4>::operator=
          (MaybeStackArray<char16_t,_4> *this,MaybeStackArray<char16_t,_4> *src)

{
  MaybeStackArray<char16_t,_4> *src_local;
  MaybeStackArray<char16_t,_4> *this_local;
  
  releaseArray(this);
  this->capacity = src->capacity;
  this->needToRelease = src->needToRelease;
  if (src->ptr == src->stackArray) {
    this->ptr = this->stackArray;
    memcpy(this->stackArray,src->stackArray,(long)src->capacity << 1);
  }
  else {
    this->ptr = src->ptr;
    resetToStackArray(src);
  }
  return this;
}

Assistant:

inline MaybeStackArray <T, stackCapacity>&
MaybeStackArray<T, stackCapacity>::operator=(MaybeStackArray <T, stackCapacity>&& src) U_NOEXCEPT {
    releaseArray();  // in case this instance had its own memory allocated
    capacity = src.capacity;
    needToRelease = src.needToRelease;
    if (src.ptr == src.stackArray) {
        ptr = stackArray;
        uprv_memcpy(stackArray, src.stackArray, sizeof(T) * src.capacity);
    } else {
        ptr = src.ptr;
        src.resetToStackArray();  // take ownership away from src
    }
    return *this;
}